

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration.h
# Opt level: O0

void __thiscall
wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
          (AbstractChildIterator<wasm::ChildIterator> *this,Expression *parent)

{
  Block *pBVar1;
  If *pIVar2;
  Loop *pLVar3;
  Break *pBVar4;
  Switch *pSVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  LocalSet *pLVar8;
  GlobalSet *pGVar9;
  Load *pLVar10;
  Store *pSVar11;
  AtomicRMW *pAVar12;
  AtomicCmpxchg *pAVar13;
  AtomicWait *pAVar14;
  AtomicNotify *pAVar15;
  SIMDExtract *pSVar16;
  SIMDReplace *pSVar17;
  SIMDShuffle *pSVar18;
  size_type sVar19;
  SIMDTernary *pSVar20;
  SIMDShift *pSVar21;
  SIMDLoad *pSVar22;
  SIMDLoadStoreLane *pSVar23;
  MemoryInit *pMVar24;
  MemoryCopy *pMVar25;
  MemoryFill *pMVar26;
  Unary *pUVar27;
  Binary *pBVar28;
  Select *pSVar29;
  Drop *pDVar30;
  Return *pRVar31;
  MemoryGrow *pMVar32;
  RefIsNull *pRVar33;
  RefEq *pRVar34;
  TableGet *pTVar35;
  TableSet *pTVar36;
  TableGrow *pTVar37;
  TableFill *pTVar38;
  TableCopy *pTVar39;
  TableInit *pTVar40;
  Try *pTVar41;
  TryTable *pTVar42;
  Throw *pTVar43;
  ThrowRef *pTVar44;
  TupleMake *pTVar45;
  TupleExtract *pTVar46;
  RefI31 *pRVar47;
  I31Get *pIVar48;
  CallRef *pCVar49;
  RefTest *pRVar50;
  RefCast *pRVar51;
  BrOn *pBVar52;
  StructNew *pSVar53;
  StructGet *pSVar54;
  StructSet *pSVar55;
  StructRMW *pSVar56;
  StructCmpxchg *pSVar57;
  ArrayNew *pAVar58;
  ArrayNewData *pAVar59;
  ArrayNewElem *pAVar60;
  ArrayNewFixed *pAVar61;
  ArrayGet *pAVar62;
  ArraySet *pAVar63;
  ArrayLen *pAVar64;
  ArrayCopy *pAVar65;
  ArrayFill *pAVar66;
  ArrayInitData *pAVar67;
  ArrayInitElem *pAVar68;
  RefAs *pRVar69;
  StringNew *pSVar70;
  StringMeasure *pSVar71;
  StringEncode *pSVar72;
  StringConcat *pSVar73;
  StringEq *pSVar74;
  StringWTF16Get *pSVar75;
  StringSliceWTF *pSVar76;
  ContNew *pCVar77;
  ContBind *pCVar78;
  Suspend *pSVar79;
  Resume *pRVar80;
  ResumeThrow *pRVar81;
  StackSwitch *pSVar82;
  size_t sVar83;
  Expression **ppEVar84;
  int local_3c4;
  int i_26;
  StackSwitch *cast_94;
  Index i_25;
  Index i_24;
  int i_23;
  Index i_22;
  ResumeThrow *cast_93;
  Index i_21;
  Index i_20;
  int i_19;
  Index i_18;
  Resume *cast_92;
  int i_17;
  Suspend *cast_91;
  int i_16;
  ContBind *cast_90;
  ContNew *cast_89;
  StringSliceWTF *cast_88;
  StringWTF16Get *cast_87;
  StringEq *cast_86;
  StringConcat *cast_85;
  StringEncode *cast_84;
  StringMeasure *cast_83;
  StringConst *cast_82;
  StringNew *cast_81;
  RefAs *cast_80;
  ArrayInitElem *cast_79;
  ArrayInitData *cast_78;
  ArrayFill *cast_77;
  ArrayCopy *cast_76;
  ArrayLen *cast_75;
  ArraySet *cast_74;
  ArrayGet *cast_73;
  int i_15;
  ArrayNewFixed *cast_72;
  ArrayNewElem *cast_71;
  ArrayNewData *cast_70;
  ArrayNew *cast_69;
  StructCmpxchg *cast_68;
  StructRMW *cast_67;
  StructSet *cast_66;
  StructGet *cast_65;
  int i_14;
  StructNew *cast_64;
  BrOn *cast_63;
  RefCast *cast_62;
  RefTest *cast_61;
  int i_13;
  CallRef *cast_60;
  I31Get *cast_59;
  RefI31 *cast_58;
  TupleExtract *cast_57;
  int i_12;
  TupleMake *cast_56;
  Pop *cast_55;
  Unreachable *cast_54;
  Nop *cast_53;
  ThrowRef *cast_52;
  Rethrow *cast_51;
  int i_11;
  Throw *cast_50;
  Index i_10;
  Index i_9;
  Index i_8;
  Index i_7;
  TryTable *cast_49;
  Index i_6;
  int i_5;
  Try *cast_48;
  TableInit *cast_47;
  TableCopy *cast_46;
  TableFill *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  Index i_4;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_3;
  CallIndirect *cast_6;
  int i_2;
  Call *cast_5;
  Index i_1;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  ChildIterator *self;
  Expression *parent_local;
  AbstractChildIterator<wasm::ChildIterator> *this_local;
  
  SmallVector<wasm::Expression_**,_4UL>::SmallVector(&this->children);
  switch(parent->_id) {
  case InvalidId:
  case NumExpressionIds:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    pBVar1 = Expression::cast<wasm::Block>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar1->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_1._4_4_ = (int)sVar83;
    while (cast_1._4_4_ = cast_1._4_4_ + -1, -1 < cast_1._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_1._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case IfId:
    pIVar2 = Expression::cast<wasm::If>(parent);
    if (pIVar2->ifFalse != (Expression *)0x0) {
      addChild(this,parent,&pIVar2->ifFalse);
    }
    addChild(this,parent,&pIVar2->ifTrue);
    addChild(this,parent,&pIVar2->condition);
    break;
  case LoopId:
    pLVar3 = Expression::cast<wasm::Loop>(parent);
    addChild(this,parent,&pLVar3->body);
    break;
  case BreakId:
    pBVar4 = Expression::cast<wasm::Break>(parent);
    if (pBVar4->condition != (Expression *)0x0) {
      addChild(this,parent,&pBVar4->condition);
    }
    if (pBVar4->value != (Expression *)0x0) {
      addChild(this,parent,&pBVar4->value);
    }
    break;
  case SwitchId:
    pSVar5 = Expression::cast<wasm::Switch>(parent);
    addChild(this,parent,&pSVar5->condition);
    if (pSVar5->value != (Expression *)0x0) {
      addChild(this,parent,&pSVar5->value);
    }
    for (cast_5._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pSVar5->targets).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_5._4_4_ < sVar83; cast_5._4_4_ = cast_5._4_4_ + 1) {
    }
    break;
  case CallId:
    pCVar6 = Expression::cast<wasm::Call>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar6->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_6._4_4_ = (int)sVar83;
    while (cast_6._4_4_ = cast_6._4_4_ + -1, -1 < cast_6._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar6->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_6._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case CallIndirectId:
    pCVar7 = Expression::cast<wasm::CallIndirect>(parent);
    addChild(this,parent,&pCVar7->target);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar7->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_7._4_4_ = (int)sVar83;
    while (cast_7._4_4_ = cast_7._4_4_ + -1, -1 < cast_7._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar7->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_7._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(parent);
    break;
  case LocalSetId:
    pLVar8 = Expression::cast<wasm::LocalSet>(parent);
    addChild(this,parent,&pLVar8->value);
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(parent);
    break;
  case GlobalSetId:
    pGVar9 = Expression::cast<wasm::GlobalSet>(parent);
    addChild(this,parent,&pGVar9->value);
    break;
  case LoadId:
    pLVar10 = Expression::cast<wasm::Load>(parent);
    addChild(this,parent,&pLVar10->ptr);
    break;
  case StoreId:
    pSVar11 = Expression::cast<wasm::Store>(parent);
    addChild(this,parent,&pSVar11->value);
    addChild(this,parent,&pSVar11->ptr);
    break;
  case ConstId:
    Expression::cast<wasm::Const>(parent);
    break;
  case UnaryId:
    pUVar27 = Expression::cast<wasm::Unary>(parent);
    addChild(this,parent,&pUVar27->value);
    break;
  case BinaryId:
    pBVar28 = Expression::cast<wasm::Binary>(parent);
    addChild(this,parent,&pBVar28->right);
    addChild(this,parent,&pBVar28->left);
    break;
  case SelectId:
    pSVar29 = Expression::cast<wasm::Select>(parent);
    addChild(this,parent,&pSVar29->condition);
    addChild(this,parent,&pSVar29->ifFalse);
    addChild(this,parent,&pSVar29->ifTrue);
    break;
  case DropId:
    pDVar30 = Expression::cast<wasm::Drop>(parent);
    addChild(this,parent,&pDVar30->value);
    break;
  case ReturnId:
    pRVar31 = Expression::cast<wasm::Return>(parent);
    if (pRVar31->value != (Expression *)0x0) {
      addChild(this,parent,&pRVar31->value);
    }
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(parent);
    break;
  case MemoryGrowId:
    pMVar32 = Expression::cast<wasm::MemoryGrow>(parent);
    addChild(this,parent,(Expression **)(pMVar32 + 0x10));
    break;
  case NopId:
    Expression::cast<wasm::Nop>(parent);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(parent);
    break;
  case AtomicRMWId:
    pAVar12 = Expression::cast<wasm::AtomicRMW>(parent);
    addChild(this,parent,&pAVar12->value);
    addChild(this,parent,&pAVar12->ptr);
    break;
  case AtomicCmpxchgId:
    pAVar13 = Expression::cast<wasm::AtomicCmpxchg>(parent);
    addChild(this,parent,&pAVar13->replacement);
    addChild(this,parent,&pAVar13->expected);
    addChild(this,parent,&pAVar13->ptr);
    break;
  case AtomicWaitId:
    pAVar14 = Expression::cast<wasm::AtomicWait>(parent);
    addChild(this,parent,(Expression **)(pAVar14 + 0x28));
    addChild(this,parent,(Expression **)(pAVar14 + 0x20));
    addChild(this,parent,(Expression **)(pAVar14 + 0x18));
    break;
  case AtomicNotifyId:
    pAVar15 = Expression::cast<wasm::AtomicNotify>(parent);
    addChild(this,parent,&pAVar15->notifyCount);
    addChild(this,parent,&pAVar15->ptr);
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(parent);
    break;
  case SIMDExtractId:
    pSVar16 = Expression::cast<wasm::SIMDExtract>(parent);
    addChild(this,parent,&pSVar16->vec);
    break;
  case SIMDReplaceId:
    pSVar17 = Expression::cast<wasm::SIMDReplace>(parent);
    addChild(this,parent,&pSVar17->value);
    addChild(this,parent,&pSVar17->vec);
    break;
  case SIMDShuffleId:
    pSVar18 = Expression::cast<wasm::SIMDShuffle>(parent);
    addChild(this,parent,&pSVar18->right);
    addChild(this,parent,&pSVar18->left);
    for (cast_21._4_4_ = 0; sVar19 = std::array<unsigned_char,_16UL>::size(&pSVar18->mask),
        cast_21._4_4_ < sVar19; cast_21._4_4_ = cast_21._4_4_ + 1) {
    }
    break;
  case SIMDTernaryId:
    pSVar20 = Expression::cast<wasm::SIMDTernary>(parent);
    addChild(this,parent,&pSVar20->c);
    addChild(this,parent,&pSVar20->b);
    addChild(this,parent,&pSVar20->a);
    break;
  case SIMDShiftId:
    pSVar21 = Expression::cast<wasm::SIMDShift>(parent);
    addChild(this,parent,&pSVar21->shift);
    addChild(this,parent,&pSVar21->vec);
    break;
  case SIMDLoadId:
    pSVar22 = Expression::cast<wasm::SIMDLoad>(parent);
    addChild(this,parent,&pSVar22->ptr);
    break;
  case SIMDLoadStoreLaneId:
    pSVar23 = Expression::cast<wasm::SIMDLoadStoreLane>(parent);
    addChild(this,parent,(Expression **)(pSVar23 + 0x38));
    addChild(this,parent,(Expression **)(pSVar23 + 0x30));
    break;
  case MemoryInitId:
    pMVar24 = Expression::cast<wasm::MemoryInit>(parent);
    addChild(this,parent,&pMVar24->size);
    addChild(this,parent,&pMVar24->offset);
    addChild(this,parent,&pMVar24->dest);
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(parent);
    break;
  case MemoryCopyId:
    pMVar25 = Expression::cast<wasm::MemoryCopy>(parent);
    addChild(this,parent,&pMVar25->size);
    addChild(this,parent,&pMVar25->source);
    addChild(this,parent,&pMVar25->dest);
    break;
  case MemoryFillId:
    pMVar26 = Expression::cast<wasm::MemoryFill>(parent);
    addChild(this,parent,&pMVar26->size);
    addChild(this,parent,&pMVar26->value);
    addChild(this,parent,&pMVar26->dest);
    break;
  case PopId:
    Expression::cast<wasm::Pop>(parent);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(parent);
    break;
  case RefIsNullId:
    pRVar33 = Expression::cast<wasm::RefIsNull>(parent);
    addChild(this,parent,&pRVar33->value);
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(parent);
    break;
  case RefEqId:
    pRVar34 = Expression::cast<wasm::RefEq>(parent);
    addChild(this,parent,&pRVar34->right);
    addChild(this,parent,&pRVar34->left);
    break;
  case TableGetId:
    pTVar35 = Expression::cast<wasm::TableGet>(parent);
    addChild(this,parent,&pTVar35->index);
    break;
  case TableSetId:
    pTVar36 = Expression::cast<wasm::TableSet>(parent);
    addChild(this,parent,&pTVar36->value);
    addChild(this,parent,&pTVar36->index);
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(parent);
    break;
  case TableGrowId:
    pTVar37 = Expression::cast<wasm::TableGrow>(parent);
    addChild(this,parent,(Expression **)(pTVar37 + 0x28));
    addChild(this,parent,(Expression **)(pTVar37 + 0x20));
    break;
  case TableFillId:
    pTVar38 = Expression::cast<wasm::TableFill>(parent);
    addChild(this,parent,(Expression **)(pTVar38 + 0x30));
    addChild(this,parent,(Expression **)(pTVar38 + 0x28));
    addChild(this,parent,(Expression **)(pTVar38 + 0x20));
    break;
  case TableCopyId:
    pTVar39 = Expression::cast<wasm::TableCopy>(parent);
    addChild(this,parent,(Expression **)(pTVar39 + 0x20));
    addChild(this,parent,(Expression **)(pTVar39 + 0x18));
    addChild(this,parent,(Expression **)(pTVar39 + 0x10));
    break;
  case TableInitId:
    pTVar40 = Expression::cast<wasm::TableInit>(parent);
    addChild(this,parent,&pTVar40->size);
    addChild(this,parent,&pTVar40->offset);
    addChild(this,parent,&pTVar40->dest);
    break;
  case TryId:
    pTVar41 = Expression::cast<wasm::Try>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar41->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_49._4_4_ = (int)sVar83;
    while (cast_49._4_4_ = cast_49._4_4_ + -1, -1 < cast_49._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar41->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_49._4_4_);
      addChild(this,parent,ppEVar84);
    }
    for (cast_49._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar41->catchTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_49 < sVar83; cast_49._0_4_ = (uint)cast_49 + 1) {
    }
    addChild(this,parent,&pTVar41->body);
    break;
  case TryTableId:
    pTVar42 = Expression::cast<wasm::TryTable>(parent);
    for (i_9 = 0; sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                                     (&(pTVar42->sentTypes).
                                       super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>),
        i_9 < sVar83; i_9 = i_9 + 1) {
    }
    for (i_10 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                           (&(pTVar42->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>),
        i_10 < sVar83; i_10 = i_10 + 1) {
    }
    for (cast_50._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar42->catchDests).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        cast_50._4_4_ < sVar83; cast_50._4_4_ = cast_50._4_4_ + 1) {
    }
    for (cast_50._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           (&(pTVar42->catchTags).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)cast_50 < sVar83; cast_50._0_4_ = (uint)cast_50 + 1) {
    }
    addChild(this,parent,&pTVar42->body);
    break;
  case ThrowId:
    pTVar43 = Expression::cast<wasm::Throw>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar43->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_51._4_4_ = (int)sVar83;
    while (cast_51._4_4_ = cast_51._4_4_ + -1, -1 < cast_51._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar43->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_51._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(parent);
    break;
  case ThrowRefId:
    pTVar44 = Expression::cast<wasm::ThrowRef>(parent);
    addChild(this,parent,&pTVar44->exnref);
    break;
  case TupleMakeId:
    pTVar45 = Expression::cast<wasm::TupleMake>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar45->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_57._4_4_ = (int)sVar83;
    while (cast_57._4_4_ = cast_57._4_4_ + -1, -1 < cast_57._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar45->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_57._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case TupleExtractId:
    pTVar46 = Expression::cast<wasm::TupleExtract>(parent);
    addChild(this,parent,&pTVar46->tuple);
    break;
  case RefI31Id:
    pRVar47 = Expression::cast<wasm::RefI31>(parent);
    addChild(this,parent,&pRVar47->value);
    break;
  case I31GetId:
    pIVar48 = Expression::cast<wasm::I31Get>(parent);
    addChild(this,parent,&pIVar48->i31);
    break;
  case CallRefId:
    pCVar49 = Expression::cast<wasm::CallRef>(parent);
    addChild(this,parent,&pCVar49->target);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar49->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_61._4_4_ = (int)sVar83;
    while (cast_61._4_4_ = cast_61._4_4_ + -1, -1 < cast_61._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar49->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_61._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case RefTestId:
    pRVar50 = Expression::cast<wasm::RefTest>(parent);
    addChild(this,parent,&pRVar50->ref);
    break;
  case RefCastId:
    pRVar51 = Expression::cast<wasm::RefCast>(parent);
    addChild(this,parent,&pRVar51->ref);
    break;
  case BrOnId:
    pBVar52 = Expression::cast<wasm::BrOn>(parent);
    addChild(this,parent,&pBVar52->ref);
    break;
  case StructNewId:
    pSVar53 = Expression::cast<wasm::StructNew>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pSVar53->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_65._4_4_ = (int)sVar83;
    while (cast_65._4_4_ = cast_65._4_4_ + -1, -1 < cast_65._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar53->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_65._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case StructGetId:
    pSVar54 = Expression::cast<wasm::StructGet>(parent);
    addChild(this,parent,&pSVar54->ref);
    break;
  case StructSetId:
    pSVar55 = Expression::cast<wasm::StructSet>(parent);
    addChild(this,parent,&pSVar55->value);
    addChild(this,parent,&pSVar55->ref);
    break;
  case StructRMWId:
    pSVar56 = Expression::cast<wasm::StructRMW>(parent);
    addChild(this,parent,(Expression **)(pSVar56 + 0x20));
    addChild(this,parent,(Expression **)(pSVar56 + 0x18));
    break;
  case StructCmpxchgId:
    pSVar57 = Expression::cast<wasm::StructCmpxchg>(parent);
    addChild(this,parent,(Expression **)(pSVar57 + 0x28));
    addChild(this,parent,(Expression **)(pSVar57 + 0x20));
    addChild(this,parent,(Expression **)(pSVar57 + 0x18));
    break;
  case ArrayNewId:
    pAVar58 = Expression::cast<wasm::ArrayNew>(parent);
    addChild(this,parent,&pAVar58->size);
    if (pAVar58->init != (Expression *)0x0) {
      addChild(this,parent,&pAVar58->init);
    }
    break;
  case ArrayNewDataId:
    pAVar59 = Expression::cast<wasm::ArrayNewData>(parent);
    addChild(this,parent,(Expression **)(pAVar59 + 0x28));
    addChild(this,parent,(Expression **)(pAVar59 + 0x20));
    break;
  case ArrayNewElemId:
    pAVar60 = Expression::cast<wasm::ArrayNewElem>(parent);
    addChild(this,parent,(Expression **)(pAVar60 + 0x28));
    addChild(this,parent,(Expression **)(pAVar60 + 0x20));
    break;
  case ArrayNewFixedId:
    pAVar61 = Expression::cast<wasm::ArrayNewFixed>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pAVar61->values).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_73._4_4_ = (int)sVar83;
    while (cast_73._4_4_ = cast_73._4_4_ + -1, -1 < cast_73._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar61->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)cast_73._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case ArrayGetId:
    pAVar62 = Expression::cast<wasm::ArrayGet>(parent);
    addChild(this,parent,&pAVar62->index);
    addChild(this,parent,&pAVar62->ref);
    break;
  case ArraySetId:
    pAVar63 = Expression::cast<wasm::ArraySet>(parent);
    addChild(this,parent,&pAVar63->value);
    addChild(this,parent,&pAVar63->index);
    addChild(this,parent,&pAVar63->ref);
    break;
  case ArrayLenId:
    pAVar64 = Expression::cast<wasm::ArrayLen>(parent);
    addChild(this,parent,&pAVar64->ref);
    break;
  case ArrayCopyId:
    pAVar65 = Expression::cast<wasm::ArrayCopy>(parent);
    addChild(this,parent,&pAVar65->length);
    addChild(this,parent,&pAVar65->srcIndex);
    addChild(this,parent,&pAVar65->srcRef);
    addChild(this,parent,&pAVar65->destIndex);
    addChild(this,parent,&pAVar65->destRef);
    break;
  case ArrayFillId:
    pAVar66 = Expression::cast<wasm::ArrayFill>(parent);
    addChild(this,parent,&pAVar66->size);
    addChild(this,parent,&pAVar66->value);
    addChild(this,parent,&pAVar66->index);
    addChild(this,parent,&pAVar66->ref);
    break;
  case ArrayInitDataId:
    pAVar67 = Expression::cast<wasm::ArrayInitData>(parent);
    addChild(this,parent,(Expression **)(pAVar67 + 0x38));
    addChild(this,parent,(Expression **)(pAVar67 + 0x30));
    addChild(this,parent,(Expression **)(pAVar67 + 0x28));
    addChild(this,parent,(Expression **)(pAVar67 + 0x20));
    break;
  case ArrayInitElemId:
    pAVar68 = Expression::cast<wasm::ArrayInitElem>(parent);
    addChild(this,parent,(Expression **)(pAVar68 + 0x38));
    addChild(this,parent,(Expression **)(pAVar68 + 0x30));
    addChild(this,parent,(Expression **)(pAVar68 + 0x28));
    addChild(this,parent,(Expression **)(pAVar68 + 0x20));
    break;
  case RefAsId:
    pRVar69 = Expression::cast<wasm::RefAs>(parent);
    addChild(this,parent,&pRVar69->value);
    break;
  case StringNewId:
    pSVar70 = Expression::cast<wasm::StringNew>(parent);
    if (pSVar70->end != (Expression *)0x0) {
      addChild(this,parent,&pSVar70->end);
    }
    if (pSVar70->start != (Expression *)0x0) {
      addChild(this,parent,&pSVar70->start);
    }
    addChild(this,parent,&pSVar70->ref);
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(parent);
    break;
  case StringMeasureId:
    pSVar71 = Expression::cast<wasm::StringMeasure>(parent);
    addChild(this,parent,&pSVar71->ref);
    break;
  case StringEncodeId:
    pSVar72 = Expression::cast<wasm::StringEncode>(parent);
    if (pSVar72->start != (Expression *)0x0) {
      addChild(this,parent,&pSVar72->start);
    }
    addChild(this,parent,&pSVar72->array);
    addChild(this,parent,&pSVar72->str);
    break;
  case StringConcatId:
    pSVar73 = Expression::cast<wasm::StringConcat>(parent);
    addChild(this,parent,&pSVar73->right);
    addChild(this,parent,&pSVar73->left);
    break;
  case StringEqId:
    pSVar74 = Expression::cast<wasm::StringEq>(parent);
    addChild(this,parent,&pSVar74->right);
    addChild(this,parent,&pSVar74->left);
    break;
  case StringWTF16GetId:
    pSVar75 = Expression::cast<wasm::StringWTF16Get>(parent);
    addChild(this,parent,&pSVar75->pos);
    addChild(this,parent,&pSVar75->ref);
    break;
  case StringSliceWTFId:
    pSVar76 = Expression::cast<wasm::StringSliceWTF>(parent);
    addChild(this,parent,&pSVar76->end);
    addChild(this,parent,&pSVar76->start);
    addChild(this,parent,&pSVar76->ref);
    break;
  case ContNewId:
    pCVar77 = Expression::cast<wasm::ContNew>(parent);
    addChild(this,parent,(Expression **)(pCVar77 + 0x10));
    break;
  case ContBindId:
    pCVar78 = Expression::cast<wasm::ContBind>(parent);
    addChild(this,parent,(Expression **)(pCVar78 + 0x30));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar78 + 0x10));
    cast_91._4_4_ = (int)sVar83;
    while (cast_91._4_4_ = cast_91._4_4_ + -1, -1 < cast_91._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar78 + 0x10),(long)cast_91._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case SuspendId:
    pSVar79 = Expression::cast<wasm::Suspend>(parent);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar79 + 0x20));
    cast_92._4_4_ = (int)sVar83;
    while (cast_92._4_4_ = cast_92._4_4_ + -1, -1 < cast_92._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar79 + 0x20),(long)cast_92._4_4_);
      addChild(this,parent,ppEVar84);
    }
    break;
  case ResumeId:
    pRVar80 = Expression::cast<wasm::Resume>(parent);
    for (i_20 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar80 + 0x78)
                           ), i_20 < sVar83; i_20 = i_20 + 1) {
    }
    addChild(this,parent,(Expression **)(pRVar80 + 0x70));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar80 + 0x50));
    i_21 = (Index)sVar83;
    while (i_21 = i_21 - 1, -1 < (int)i_21) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pRVar80 + 0x50),(long)(int)i_21);
      addChild(this,parent,ppEVar84);
    }
    for (cast_93._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar80 + 0x30)
                           ), cast_93._4_4_ < sVar83; cast_93._4_4_ = cast_93._4_4_ + 1) {
    }
    for (cast_93._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar80 + 0x10)
                           ), (uint)cast_93 < sVar83; cast_93._0_4_ = (uint)cast_93 + 1) {
    }
    break;
  case ResumeThrowId:
    pRVar81 = Expression::cast<wasm::ResumeThrow>(parent);
    for (i_24 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar81 + 0x88)
                           ), i_24 < sVar83; i_24 = i_24 + 1) {
    }
    addChild(this,parent,(Expression **)(pRVar81 + 0x80));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar81 + 0x60));
    i_25 = (Index)sVar83;
    while (i_25 = i_25 - 1, -1 < (int)i_25) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pRVar81 + 0x60),(long)(int)i_25);
      addChild(this,parent,ppEVar84);
    }
    for (cast_94._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar81 + 0x40)
                           ), cast_94._4_4_ < sVar83; cast_94._4_4_ = cast_94._4_4_ + 1) {
    }
    for (cast_94._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar81 + 0x20)
                           ), (uint)cast_94 < sVar83; cast_94._0_4_ = (uint)cast_94 + 1) {
    }
    break;
  case StackSwitchId:
    pSVar82 = Expression::cast<wasm::StackSwitch>(parent);
    addChild(this,parent,(Expression **)(pSVar82 + 0x40));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar82 + 0x20));
    local_3c4 = (int)sVar83;
    while (local_3c4 = local_3c4 + -1, -1 < local_3c4) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar82 + 0x20),(long)local_3c4);
      addChild(this,parent,ppEVar84);
    }
  }
  return;
}

Assistant:

AbstractChildIterator(Expression* parent) {
    auto* self = (Specific*)this;

#define DELEGATE_ID parent->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = parent->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field) self->addChild(parent, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  if (cast->field) {                                                           \
    self->addChild(parent, &cast->field);                                      \
  }

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }